

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRead.c
# Opt level: O2

int Cudd_bddRead(FILE *fp,DdManager *dd,DdNode **E,DdNode ***x,DdNode ***y,int *nx,int *ny,int *m,
                int *n,int bx,int sx,int by,int sy)

{
  int *piVar1;
  DdNode *T;
  FILE *__stream;
  DdNode **ppDVar2;
  int iVar3;
  DdNode **ppDVar4;
  DdNode *pDVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  DdNode *pDVar9;
  int v;
  int u;
  int *local_68;
  long local_60;
  DdNode **local_58;
  long local_50;
  DdNode **local_48;
  FILE *local_40;
  DdNode **local_38;
  
  T = dd->one;
  local_68 = nx;
  iVar3 = __isoc99_fscanf(fp,"%d %d",&u,&v);
  if (iVar3 != 2) {
    return 0;
  }
  pDVar9 = (DdNode *)((ulong)T ^ 1);
  *m = u;
  ppDVar4 = *x;
  sVar8 = 0;
  local_60 = 0;
  for (u = u - 1; 0 < u; u = (uint)u >> 1) {
    local_60 = local_60 + 1;
    sVar8 = sVar8 + 8;
  }
  local_48 = E;
  local_40 = (FILE *)fp;
  if (*local_68 < (int)local_60) {
    if (ppDVar4 == (DdNode **)0x0) {
      ppDVar4 = (DdNode **)malloc(sVar8);
    }
    else {
      ppDVar4 = (DdNode **)realloc(ppDVar4,sVar8);
    }
    *x = ppDVar4;
    if (ppDVar4 != (DdNode **)0x0) goto LAB_00660f91;
LAB_00661070:
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_006612a6:
    iVar3 = 0;
  }
  else {
LAB_00660f91:
    *n = v;
    local_58 = *y;
    sVar8 = 0;
    lVar6 = 0;
    for (v = v - 1; 0 < v; v = (uint)v >> 1) {
      lVar6 = lVar6 + 1;
      sVar8 = sVar8 + 8;
    }
    if (*ny < (int)lVar6) {
      if (local_58 == (DdNode **)0x0) {
        local_58 = (DdNode **)malloc(sVar8);
      }
      else {
        local_58 = (DdNode **)realloc(local_58,sVar8);
      }
      *y = local_58;
      if (local_58 == (DdNode **)0x0) goto LAB_00661070;
    }
    iVar3 = *local_68 * sx + bx;
    local_50 = lVar6;
    for (lVar7 = (long)*local_68; lVar7 < local_60; lVar7 = lVar7 + 1) {
      do {
        dd->reordered = 0;
        pDVar5 = cuddUniqueInter(dd,iVar3,T,pDVar9);
        ppDVar4[lVar7] = pDVar5;
      } while (dd->reordered == 1);
      if (pDVar5 == (DdNode *)0x0) goto LAB_006612a6;
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      iVar3 = iVar3 + sx;
    }
    iVar3 = *ny * sy + by;
    local_38 = ppDVar4;
    for (lVar6 = (long)*ny; ppDVar2 = local_38, __stream = local_40, ppDVar4 = local_58,
        lVar6 < local_50; lVar6 = lVar6 + 1) {
      do {
        dd->reordered = 0;
        pDVar5 = cuddUniqueInter(dd,iVar3,T,pDVar9);
        ppDVar4[lVar6] = pDVar5;
      } while (dd->reordered == 1);
      if (pDVar5 == (DdNode *)0x0) goto LAB_006612a6;
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      iVar3 = iVar3 + sy;
    }
    *local_68 = (int)local_60;
    *ny = (int)local_50;
    *local_48 = pDVar9;
    local_68 = (int *)((ulong)T & 0xfffffffffffffffe);
    *(int *)((long)local_68 + 4U) = *(int *)((long)local_68 + 4U) + 1;
    while (piVar1 = local_68, iVar3 = feof(__stream), iVar3 == 0) {
      iVar3 = __isoc99_fscanf(__stream,"%d %d",&u,&v);
      if (iVar3 != 2) {
        if (iVar3 != -1) {
          return 0;
        }
        break;
      }
      if (((*m <= u) || (*n <= v)) || ((v | u) < 0)) goto LAB_006612a6;
      *(int *)((long)piVar1 + 4U) = *(int *)((long)piVar1 + 4U) + 1;
      pDVar9 = T;
      for (lVar6 = local_60; lVar7 = local_50, 0 < lVar6; lVar6 = lVar6 + -1) {
        pDVar5 = (DdNode *)((ulong)ppDVar2[lVar6 + -1] ^ 1);
        if ((u & 1U) != 0) {
          pDVar5 = ppDVar2[lVar6 + -1];
        }
        pDVar5 = Cudd_bddAnd(dd,pDVar9,pDVar5);
        if (pDVar5 == (DdNode *)0x0) goto LAB_006612a1;
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar9);
        u = u >> 1;
        pDVar9 = pDVar5;
      }
      for (; ppDVar4 = local_48, 0 < lVar7; lVar7 = lVar7 + -1) {
        pDVar5 = (DdNode *)((ulong)local_58[lVar7 + -1] ^ 1);
        if ((v & 1U) != 0) {
          pDVar5 = local_58[lVar7 + -1];
        }
        pDVar5 = Cudd_bddAnd(dd,pDVar9,pDVar5);
        if (pDVar5 == (DdNode *)0x0) goto LAB_006612a1;
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar9);
        v = v >> 1;
        pDVar9 = pDVar5;
      }
      pDVar5 = Cudd_bddAnd(dd,(DdNode *)((ulong)pDVar9 ^ 1),(DdNode *)((ulong)*local_48 ^ 1));
      if (pDVar5 == (DdNode *)0x0) {
LAB_006612a1:
        Cudd_RecursiveDeref(dd,pDVar9);
        goto LAB_006612a6;
      }
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar9);
      Cudd_RecursiveDeref(dd,*ppDVar4);
      *ppDVar4 = (DdNode *)((ulong)pDVar5 ^ 1);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int
Cudd_bddRead(
  FILE * fp /* input file pointer */,
  DdManager * dd /* DD manager */,
  DdNode ** E /* characteristic function of the graph */,
  DdNode *** x /* array of row variables */,
  DdNode *** y /* array of column variables */,
  int * nx /* number or row variables */,
  int * ny /* number or column variables */,
  int * m /* number of rows */,
  int * n /* number of columns */,
  int  bx /* first index of row variables */,
  int  sx /* step of row variables */,
  int  by /* first index of column variables */,
  int  sy /* step of column variables */)
{
    DdNode *one, *zero;
    DdNode *w;
    DdNode *minterm1;
    int u, v, err, i, nv;
    int lnx, lny;
    DdNode **lx, **ly;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    err = fscanf(fp, "%d %d", &u, &v);
    if (err == EOF) {
        return(0);
    } else if (err != 2) {
        return(0);
    }

    *m = u;
    /* Compute the number of x variables. */
    lx = *x;
    u--;        /* row and column numbers start from 0 */
    for (lnx=0; u > 0; lnx++) {
        u >>= 1;
    }
    if (lnx > *nx) {
        *x = lx = ABC_REALLOC(DdNode *, *x, lnx);
        if (lx == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    *n = v;
    /* Compute the number of y variables. */
    ly = *y;
    v--;        /* row and column numbers start from 0 */
    for (lny=0; v > 0; lny++) {
        v >>= 1;
    }
    if (lny > *ny) {
        *y = ly = ABC_REALLOC(DdNode *, *y, lny);
        if (ly == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    /* Create all new variables. */
    for (i = *nx, nv = bx + (*nx) * sx; i < lnx; i++, nv += sx) {
        do {
            dd->reordered = 0;
            lx[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (lx[i] == NULL) return(0);
        cuddRef(lx[i]);
    }
    for (i = *ny, nv = by + (*ny) * sy; i < lny; i++, nv += sy) {
        do {
            dd->reordered = 0;
            ly[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (ly[i] == NULL) return(0);
        cuddRef(ly[i]);
    }
    *nx = lnx;
    *ny = lny;

    *E = zero; /* this call will never cause reordering */
    cuddRef(*E);

    while (! feof(fp)) {
        err = fscanf(fp, "%d %d", &u, &v);
        if (err == EOF) {
            break;
        } else if (err != 2) {
            return(0);
        } else if (u >= *m || v >= *n || u < 0 || v < 0) {
            return(0);
        }
 
        minterm1 = one; cuddRef(minterm1);

        /* Build minterm1 corresponding to this arc. */
        for (i = lnx - 1; i>=0; i--) {
            if (u & 1) {
                w = Cudd_bddAnd(dd, minterm1, lx[i]);
            } else {
                w = Cudd_bddAnd(dd, minterm1, Cudd_Not(lx[i]));
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd,minterm1);
            minterm1 = w;
            u >>= 1;
        }
        for (i = lny - 1; i>=0; i--) {
            if (v & 1) {
                w = Cudd_bddAnd(dd, minterm1, ly[i]);
            } else {
                w = Cudd_bddAnd(dd, minterm1, Cudd_Not(ly[i]));
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            v >>= 1;
        }

        w = Cudd_bddAnd(dd, Cudd_Not(minterm1), Cudd_Not(*E));
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            return(0);
        }
        w = Cudd_Not(w);
        cuddRef(w);
        Cudd_RecursiveDeref(dd, minterm1);
        Cudd_RecursiveDeref(dd, *E);
        *E = w;
    }
    return(1);

}